

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O1

bool Function_Template::form2_ProjectionProfile(ProjectionProfileForm2 ProjectionProfile)

{
  uint uVar1;
  byte value;
  uint uVar2;
  int iVar3;
  undefined1 auVar4 [8];
  ulong uVar5;
  _func_int **pp_Var6;
  long lVar7;
  bool bVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> projection;
  Image image;
  undefined1 local_78 [8];
  _func_int **pp_Stack_70;
  pointer local_68;
  Image local_48;
  
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            ((ImageTemplate<unsigned_char> *)local_78,0,0,'\x01','\x01');
  Test_Helper::uniformImage(&local_48,value,0,0,(Image *)local_78);
  local_78 = (undefined1  [8])&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear((ImageTemplate<unsigned_char> *)local_78);
  uVar2 = rand();
  local_78 = (undefined1  [8])0x0;
  pp_Stack_70 = (_func_int **)0x0;
  local_68 = (pointer)0x0;
  (*ProjectionProfile)
            (&local_48,(uVar2 & 1) == 0,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_78);
  uVar1 = local_48._height;
  if ((uVar2 & 1) == 0) {
    uVar1 = local_48._width;
    local_48._width = local_48._height;
  }
  uVar5 = (long)pp_Stack_70 - (long)local_78;
  if ((long)uVar5 >> 2 != (ulong)uVar1) {
    bVar8 = false;
    goto LAB_00155d3c;
  }
  iVar3 = local_48._width * value;
  auVar4 = local_78;
  if (0 < (long)uVar5 >> 4) {
    auVar4 = (undefined1  [8])((uVar5 & 0xfffffffffffffff0) + (long)local_78);
    lVar7 = ((long)uVar5 >> 4) + 1;
    pp_Var6 = (_func_int **)((long)local_78 + 8);
    do {
      if (iVar3 != *(int *)(pp_Var6 + -1)) {
        pp_Var6 = pp_Var6 + -1;
        goto LAB_00155d36;
      }
      if (iVar3 != *(int *)((long)pp_Var6 + -4)) {
        pp_Var6 = (_func_int **)((long)pp_Var6 + -4);
        goto LAB_00155d36;
      }
      if (iVar3 != *(int *)pp_Var6) goto LAB_00155d36;
      if (iVar3 != *(int *)((long)pp_Var6 + 4)) {
        pp_Var6 = (_func_int **)((long)pp_Var6 + 4);
        goto LAB_00155d36;
      }
      lVar7 = lVar7 + -1;
      pp_Var6 = pp_Var6 + 2;
    } while (1 < lVar7);
  }
  lVar7 = (long)pp_Stack_70 - (long)auVar4 >> 2;
  if (lVar7 == 1) {
LAB_00155d17:
    pp_Var6 = (_func_int **)auVar4;
    if (iVar3 == *(int *)auVar4) {
      pp_Var6 = pp_Stack_70;
    }
  }
  else if (lVar7 == 2) {
LAB_00155d0f:
    pp_Var6 = (_func_int **)auVar4;
    if (iVar3 == *(int *)auVar4) {
      auVar4 = (undefined1  [8])((long)auVar4 + 4);
      goto LAB_00155d17;
    }
  }
  else {
    pp_Var6 = pp_Stack_70;
    if ((lVar7 == 3) && (pp_Var6 = (_func_int **)auVar4, iVar3 == *(int *)auVar4)) {
      auVar4 = (undefined1  [8])((long)auVar4 + 4);
      goto LAB_00155d0f;
    }
  }
LAB_00155d36:
  bVar8 = pp_Var6 == pp_Stack_70;
LAB_00155d3c:
  if (local_78 != (undefined1  [8])0x0) {
    operator_delete((void *)local_78);
  }
  local_48._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00219948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_48);
  return bVar8;
}

Assistant:

bool form2_ProjectionProfile(ProjectionProfileForm2 ProjectionProfile)
    {
        const uint8_t intensity = intensityValue();
        const PenguinV_Image::Image image = uniformImage( intensity );

        const bool horizontal = (randomValue<int>(2) == 0);

        std::vector < uint32_t > projection;
        ProjectionProfile( image, horizontal, projection );

        const uint32_t value = (horizontal ? image.height() : image.width()) * intensity;

        return projection.size() == (horizontal ? image.width() : image.height()) &&
            std::all_of( projection.begin(), projection.end(), [&value]( uint32_t v ) { return value == v; } );
    }